

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O1

int PARMCI_Init(void)

{
  int iVar1;
  
  iVar1 = comex_init();
  if (iVar1 != 0) {
    __assert_fail("COMEX_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x196,"int PARMCI_Init()");
  }
  iVar1 = comex_group_comm(0,&ARMCI_COMM_WORLD);
  if (iVar1 == 0) {
    ARMCI_Default_Proc_Group = 0;
    armci_init_domains(ARMCI_COMM_WORLD);
    return 0;
  }
  __assert_fail("COMEX_SUCCESS == rc",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                ,0x198,"int PARMCI_Init()");
}

Assistant:

int PARMCI_Init()
{
    int rc = comex_init();
    assert(COMEX_SUCCESS == rc);
    rc = comex_group_comm(COMEX_GROUP_WORLD, &ARMCI_COMM_WORLD);
    assert(COMEX_SUCCESS == rc);
    ARMCI_Default_Proc_Group = 0;
    armci_init_domains(ARMCI_COMM_WORLD);
    return rc;
}